

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::iterate(LongRunningShaderCase *this)

{
  pointer pcVar1;
  Params *pPVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pVVar10;
  pointer pVVar11;
  int iVar12;
  deUint32 dVar13;
  undefined4 uVar14;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  NotSupportedError *this_00;
  ulong uVar17;
  uint uVar18;
  size_type __n;
  uint uVar19;
  float *pfVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  vector<int,_std::allocator<int>_> iterCounts;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Random rnd;
  long *local_128;
  long local_120;
  long local_118 [2];
  vector<int,_std::allocator<int>_> local_108;
  Type local_f0;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  int local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  undefined1 local_b0 [24];
  int local_98;
  VertexArrayPointer local_90;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_70;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_58;
  deRandom local_40;
  long lVar15;
  
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar12);
  pPVar2 = this->m_params;
  dVar13 = deStringHash(pPVar2->name);
  uVar19 = (pPVar2->shaderType >> 0x10 ^ pPVar2->shaderType ^ 0x3d) * 9;
  uVar18 = (pPVar2->loopType >> 0x10 ^ pPVar2->loopType ^ 0x3d) * 9;
  uVar4 = (pPVar2->iterCountType >> 0x10 ^ pPVar2->iterCountType ^ 0x3d) * 9;
  uVar5 = ((uint)pPVar2->minLoopIterCount >> 0x10 ^ pPVar2->minLoopIterCount ^ 0x3d) * 9;
  uVar6 = ((uint)pPVar2->maxLoopIterCount >> 0x10 ^ pPVar2->maxLoopIterCount ^ 0x3d) * 9;
  uVar7 = ((uint)pPVar2->numInvocations >> 0x10 ^ pPVar2->numInvocations ^ 0x3d) * 9;
  uVar19 = (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d ^ (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d ^
           (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d ^ (uVar4 >> 4 ^ uVar4) * 0x27d4eb2d ^
           (uVar18 >> 4 ^ uVar18) * 0x27d4eb2d ^ (uVar19 >> 4 ^ uVar19) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar19 >> 0xf ^ dVar13 ^ uVar19);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_70,(long)this->m_params->numInvocations,(allocator_type *)local_c0);
  __n = 1;
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    __n = (size_type)this->m_params->numInvocations;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__n,(allocator_type *)local_c0);
  local_58.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_58.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a_position","");
  pVVar11 = local_70.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pVVar10 = local_70.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_f0 = TYPE_NAME;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_128,local_120 + (long)local_128);
  local_c8 = 0;
  local_c0._0_4_ = local_f0;
  pcVar1 = local_b0 + 8;
  local_b8._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_e8,local_e0 + (long)local_e8);
  local_98 = local_c8;
  local_90.componentType = VTX_COMP_FLOAT;
  local_90.convert = VTX_COMP_CONVERT_NONE;
  local_90.numComponents = 2;
  local_90.numElements = (int)((ulong)((long)pVVar11 - (long)pVVar10) >> 3);
  local_90.stride = 0;
  local_90.data = pVVar10;
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_58,(VertexArrayBinding *)local_c0);
  if (local_b8._M_p != pcVar1) {
    operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    local_128 = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a_iterCount","");
    piVar9 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar8 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_f0 = TYPE_NAME;
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_128,local_120 + (long)local_128);
    local_c8 = 0;
    local_c0._0_4_ = local_f0;
    local_b8._M_p = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_e8,local_e0 + (long)local_e8);
    local_98 = local_c8;
    local_90.componentType = VTX_COMP_SIGNED_INT32;
    local_90.convert = VTX_COMP_CONVERT_NONE;
    local_90.numComponents = 1;
    local_90.numElements = (int)((ulong)((long)piVar9 - (long)piVar8) >> 2);
    local_90.stride = 0;
    local_90.data = piVar8;
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>(&local_58,(VertexArrayBinding *)local_c0);
    if (local_b8._M_p != pcVar1) {
      operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
    }
    if (local_128 != local_118) {
      operator_delete(local_128,local_118[0] + 1);
    }
  }
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar12 = pRVar16->m_width;
  iVar21 = pRVar16->m_height;
  uVar19 = (uint)((ulong)((long)local_70.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_70.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar19 <= iVar21 * iVar12) {
    if (0 < (int)uVar19) {
      uVar17 = 0;
      do {
        uVar18 = (int)uVar17 >> 0x1f;
        fVar22 = ((float)(int)((long)((ulong)uVar18 << 0x20 | uVar17 & 0xffffffff) % (long)iVar12) +
                 0.5) / (float)iVar12;
        fVar23 = ((float)(int)((long)((ulong)uVar18 << 0x20 | uVar17 & 0xffffffff) / (long)iVar21) +
                 0.5) / (float)iVar21;
        local_70.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[0] = fVar22 + fVar22 + -1.0;
        local_70.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[1] = fVar23 + fVar23 + -1.0;
        uVar17 = uVar17 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar17);
    }
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pfVar20 = (float *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      do {
        iVar12 = this->m_params->minLoopIterCount;
        iVar21 = this->m_params->maxLoopIterCount;
        if (iVar21 == 0x7fffffff && iVar12 == -0x80000000) {
          fVar22 = (float)deRandom_getUint32(&local_40);
        }
        else {
          dVar13 = deRandom_getUint32(&local_40);
          fVar22 = (float)(dVar13 % ((iVar21 - iVar12) + 1U) + iVar12);
        }
        ((pointer)pfVar20)->m_data[0] = fVar22;
        pfVar20 = ((pointer)pfVar20)->m_data + 1;
      } while (pfVar20 !=
               (float *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    }
    (**(code **)(lVar15 + 0x1680))((this->m_program->m_program).m_program);
    if (this->m_params->iterCountType == ITERCOUNTTYPE_UNIFORM) {
      pcVar3 = *(code **)(lVar15 + 0x14f0);
      uVar14 = (**(code **)(lVar15 + 0xb48))((this->m_program->m_program).m_program,"u_iterCount");
      (*pcVar3)(uVar14,*(float *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
    }
    local_c0._4_4_ = this->m_params->numInvocations;
    local_c0._0_4_ = 6;
    local_b8._M_p._0_4_ = 3;
    local_b0._0_8_ = (void *)0x0;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,(this->m_program->m_program).m_program
              ,(int)((ulong)((long)local_58.
                                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58.
                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
              local_58.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_c0,
              (DrawUtilCallback *)0x0);
    iVar12 = this->m_numCaseIters;
    iVar21 = this->m_caseIterNdx + 1;
    this->m_caseIterNdx = iVar21;
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
              (&local_58);
    if ((pointer)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (IterateResult)(iVar21 < iVar12);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_c0 = (undefined1  [8])local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Too small viewport to fit all test points","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_c0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

LongRunningShaderCase::IterateResult LongRunningShaderCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	de::Random						rnd				(getSeed(*m_params));
	vector<Vec2>					positions		(m_params->numInvocations);
	vector<int>						iterCounts		(m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC ? m_params->numInvocations : 1);
	vector<glu::VertexArrayBinding>	vertexArrays;

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)positions.size(), 0, positions[0].getPtr()));
	if (m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC)
		vertexArrays.push_back(glu::va::Int32("a_iterCount", 1, (int)iterCounts.size(), 0, &iterCounts[0]));

	genPositions(m_context.getRenderTarget(), (int)positions.size(), &positions[0]);

	for (vector<int>::iterator i = iterCounts.begin(); i != iterCounts.end(); ++i)
		*i = rnd.getInt(m_params->minLoopIterCount, m_params->maxLoopIterCount);

	gl.useProgram(m_program->getProgram());

	if (m_params->iterCountType == ITERCOUNTTYPE_UNIFORM)
		gl.uniform1i(gl.getUniformLocation(m_program->getProgram(), "u_iterCount"), iterCounts[0]);

	glu::draw(m_context.getRenderContext(), m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(m_params->numInvocations));

	m_caseIterNdx += 1;
	return (m_caseIterNdx < m_numCaseIters) ? CONTINUE : STOP;
}